

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::detail::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  int *this;
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint64_t value;
  bool bVar10;
  bool bVar11;
  undefined1 local_328 [8];
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  bigint *local_40;
  
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  denominator._168_8_ = &PTR_grow_002b8c50;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&numerator.bigits_.super_buffer<unsigned_int>.capacity_;
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  numerator.bigits_._160_4_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  lower._168_8_ = &PTR_grow_002b8c50;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&denominator.bigits_.super_buffer<unsigned_int>.capacity_;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  denominator.bigits_._160_4_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  upper_store._168_8_ = &PTR_grow_002b8c50;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&lower.bigits_.super_buffer<unsigned_int>.capacity_;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  lower.bigits_._160_4_ = 0;
  local_40 = (bigint *)local_328;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  local_328 = (undefined1  [8])&PTR_grow_002b8c50;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&upper_store.bigits_.super_buffer<unsigned_int>.capacity_;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  upper_store.bigits_._160_4_ = 0;
  uVar5 = (ulong)d & 0xfffffffffffff;
  uVar8 = (uint)((ulong)d >> 0x34) & 0x7ff;
  if (uVar8 == 0) {
    value = uVar5 * 2;
    iVar4 = -0x432;
    iVar6 = 1;
    bVar10 = false;
LAB_0023028a:
    if (*exp10 < 0) {
      bigint::assign_pow10((bigint *)&denominator.exp_,-*exp10);
      bigint::assign((bigint *)&upper_store.exp_,(bigint *)&denominator.exp_);
      if (bVar10) {
        local_40 = (bigint *)local_328;
        bigint::assign(local_40,(bigint *)&denominator.exp_);
        bigint::operator<<=((bigint *)local_328,1);
      }
      else {
        local_40 = (bigint *)0x0;
      }
      bigint::operator*=((bigint *)&denominator.exp_,value);
      bigint::assign((bigint *)&lower.exp_,1);
      bigint::operator<<=((bigint *)&lower.exp_,iVar6 - iVar4);
    }
    else {
      bigint::assign((bigint *)&denominator.exp_,value);
      bigint::assign_pow10((bigint *)&lower.exp_,*exp10);
      bigint::operator<<=((bigint *)&lower.exp_,iVar6 - iVar4);
      bigint::assign((bigint *)&upper_store.exp_,1);
      if (bVar10) {
        bigint::assign((bigint *)local_328,2);
      }
      else {
        local_40 = (bigint *)0x0;
      }
    }
  }
  else {
    uVar9 = uVar5 + 0x10000000000000;
    iVar4 = uVar8 - 0x433;
    bVar11 = uVar5 == 0;
    bVar10 = uVar8 != 1 && bVar11;
    iVar6 = bVar10 + 1;
    value = uVar9 << (sbyte)iVar6;
    uVar5 = uVar9;
    if (uVar8 < 0x433) goto LAB_0023028a;
    bigint::assign((bigint *)&denominator.exp_,value);
    bigint::operator<<=((bigint *)&denominator.exp_,iVar4);
    bigint::assign((bigint *)&upper_store.exp_,1);
    bigint::operator<<=((bigint *)&upper_store.exp_,iVar4);
    if (uVar8 != 1 && bVar11) {
      local_40 = (bigint *)local_328;
      bigint::assign(local_40,1);
      bigint::operator<<=((bigint *)local_328,uVar8 - 0x432);
    }
    else {
      local_40 = (bigint *)0x0;
    }
    bigint::assign_pow10((bigint *)&lower.exp_,*exp10);
    bigint::operator<<=((bigint *)&lower.exp_,1);
  }
  numerator._168_8_ = local_40;
  if (local_40 == (bigint *)0x0) {
    numerator._168_8_ = &upper_store.exp_;
  }
  pcVar1 = buf->ptr_;
  uVar8 = ~(uint)uVar5 & 1;
  lVar7 = 0;
  this = &denominator.exp_;
  while( true ) {
    uVar3 = bigint::divmod_assign((bigint *)this,(bigint *)&lower.exp_);
    iVar4 = compare((bigint *)this,(bigint *)&upper_store.exp_);
    iVar6 = add_compare((bigint *)this,(bigint *)numerator._168_8_,(bigint *)&lower.exp_);
    pcVar1[lVar7] = (char)uVar3 + '0';
    if ((iVar4 < (int)uVar8) || ((int)-uVar8 < iVar6)) break;
    bigint::multiply((bigint *)this,10);
    bigint::multiply((bigint *)&upper_store.exp_,10);
    if (local_40 != (bigint *)0x0) {
      bigint::multiply(local_40,10);
    }
    lVar7 = lVar7 + 1;
  }
  if (iVar4 < (int)uVar8) {
    if (iVar6 <= (int)-uVar8) goto LAB_002304c0;
    iVar4 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                        (bigint *)&lower.exp_);
    if ((iVar4 < 1) && ((uVar3 & 1) == 0 || iVar4 != 0)) goto LAB_002304c0;
    cVar2 = pcVar1[lVar7] + '\x01';
  }
  else {
    cVar2 = (char)uVar3 + '1';
  }
  pcVar1[lVar7] = cVar2;
LAB_002304c0:
  uVar9 = lVar7 + 1U & 0xffffffff;
  uVar5 = buf->capacity_;
  if (uVar5 < uVar9) {
    (**buf->_vptr_buffer)(buf,uVar9);
    uVar5 = buf->capacity_;
  }
  if (uVar5 < uVar9) {
    uVar9 = uVar5;
  }
  buf->size_ = uVar9;
  *exp10 = *exp10 - (int)lVar7;
  bigint::~bigint((bigint *)local_328);
  bigint::~bigint((bigint *)&upper_store.exp_);
  bigint::~bigint((bigint *)&lower.exp_);
  bigint::~bigint((bigint *)&denominator.exp_);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.try_resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}